

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BringWindowToDisplayBack(ImGuiWindow *window)

{
  uint uVar1;
  ImGuiWindow **__src;
  ImGuiContext *pIVar2;
  size_t __n;
  
  pIVar2 = GImGui;
  uVar1 = (GImGui->Windows).Size;
  if ((int)uVar1 < 1) {
LAB_00147310:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                  ,0x4d8,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
  }
  __src = (GImGui->Windows).Data;
  if (*__src != window) {
    __n = 0;
    do {
      if (*(ImGuiWindow **)((long)__src + __n) == window) {
        if ((uVar1 != 1) && (memmove(__src + 1,__src,__n), 0 < (pIVar2->Windows).Size)) {
          *(pIVar2->Windows).Data = window;
          return;
        }
        goto LAB_00147310;
      }
      __n = __n + 8;
    } while ((ulong)uVar1 * 8 - __n != 0);
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayBack(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.Windows[0] == window)
        return;
    for (int i = 0; i < g.Windows.Size; i++)
        if (g.Windows[i] == window)
        {
            memmove(&g.Windows[1], &g.Windows[0], (size_t)i * sizeof(ImGuiWindow*));
            g.Windows[0] = window;
            break;
        }
}